

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_toradix(mp_int *a,char *str,int radix)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  mp_digit d;
  mp_int local_50;
  mp_digit local_38;
  
  iVar3 = -3;
  if (0xffffffc0 < radix - 0x41U) {
    if (a->used == 0) {
      str[0] = '0';
      str[1] = '\0';
      iVar3 = 0;
    }
    else {
      iVar3 = mp_init_copy(&local_50,a);
      if (iVar3 == 0) {
        if (local_50.sign == 1) {
          *str = '-';
          str = str + 1;
          local_50.sign = 0;
        }
        pcVar5 = str;
        if (local_50.used != 0) {
          lVar6 = 2;
          do {
            iVar3 = mp_div_d(&local_50,(ulong)(uint)radix,&local_50,&local_38);
            if (iVar3 != 0) goto LAB_00108615;
            *pcVar5 = mp_s_rmap[local_38];
            pcVar5 = pcVar5 + 1;
            lVar6 = lVar6 + -1;
          } while (local_50.used != 0);
          if ((int)lVar6 != 1) {
            lVar4 = 0;
            lVar6 = -lVar6;
            do {
              cVar1 = str[lVar4];
              str[lVar4] = str[lVar6 + 1];
              str[lVar6 + 1] = cVar1;
              lVar4 = lVar4 + 1;
              bVar2 = lVar4 < lVar6;
              lVar6 = lVar6 + -1;
            } while (bVar2);
          }
        }
        *pcVar5 = '\0';
        iVar3 = 0;
LAB_00108615:
        if (local_50.dp != (mp_digit *)0x0) {
          free(local_50.dp);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mp_toradix (mp_int * a, char *str, int radix)
{
  int     res, digs;
  mp_int  t;
  mp_digit d;
  char   *_s = str;

  /* check range of the radix */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* quick out if its zero */
  if (mp_iszero(a) == 1) {
     *str++ = '0';
     *str = '\0';
     return MP_OKAY;
  }

  if ((res = mp_init_copy (&t, a)) != MP_OKAY) {
    return res;
  }

  /* if it is negative output a - */
  if (t.sign == MP_NEG) {
    ++_s;
    *str++ = '-';
    t.sign = MP_ZPOS;
  }

  digs = 0;
  while (mp_iszero (&t) == 0) {
    if ((res = mp_div_d (&t, (mp_digit) radix, &t, &d)) != MP_OKAY) {
      mp_clear (&t);
      return res;
    }
    *str++ = mp_s_rmap[d];
    ++digs;
  }

  /* reverse the digits of the string.  In this case _s points
   * to the first digit [exluding the sign] of the number]
   */
  bn_reverse ((unsigned char *)_s, digs);

  /* append a NULL so the string is properly terminated */
  *str = '\0';

  mp_clear (&t);
  return MP_OKAY;
}